

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void ImageAlphaMask(Image *image,Image alphaMask)

{
  void *pvVar1;
  Image image_00;
  void *pvVar2;
  int i;
  uint uVar3;
  char *text;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  undefined8 unaff_retaddr;
  Image local_30;
  
  if ((image->width != alphaMask.width) || (image->height != alphaMask.height)) {
    text = "IMAGE: Alpha mask must be same size as image";
LAB_00140dad:
    TraceLog(4,text);
    return;
  }
  if (10 < image->format) {
    text = "IMAGE: Alpha mask can not be applied to compressed data formats";
    goto LAB_00140dad;
  }
  image_00._8_8_ = alphaMask.data;
  image_00.data = (void *)unaff_retaddr;
  image_00.mipmaps = alphaMask.width;
  image_00.format = alphaMask.height;
  ImageCopy(image_00);
  if (local_30.format != 1) {
    ImageFormat(&local_30,1);
  }
  if (image->format != 7) {
    if (image->format == 1) {
      lVar6 = (long)image->height * (long)image->width;
      pvVar2 = malloc(lVar6 * 2);
      uVar5 = (uint)lVar6;
      uVar3 = local_30.height * local_30.width;
      if (local_30.height * local_30.width < (int)uVar5) {
        uVar3 = uVar5;
      }
      if (0 < (int)uVar3) {
        pvVar1 = image->data;
        uVar4 = 0;
        do {
          *(undefined1 *)((long)pvVar2 + uVar4 * 2) = *(undefined1 *)((long)pvVar1 + uVar4);
          *(undefined1 *)((long)pvVar2 + uVar4 * 2 + 1) =
               *(undefined1 *)((long)local_30.data + uVar4);
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      free(image->data);
      image->data = pvVar2;
      image->format = 2;
      goto LAB_00140e6b;
    }
    ImageFormat(image,7);
  }
  for (lVar6 = 0;
      (lVar6 < (long)local_30.height * (long)local_30.width ||
      (lVar6 < (long)image->height * (long)image->width)); lVar6 = lVar6 + 1) {
    *(undefined1 *)((long)image->data + lVar6 * 4 + 3) =
         *(undefined1 *)((long)local_30.data + lVar6);
  }
LAB_00140e6b:
  free(local_30.data);
  return;
}

Assistant:

void ImageAlphaMask(Image *image, Image alphaMask)
{
    if ((image->width != alphaMask.width) || (image->height != alphaMask.height))
    {
        TRACELOG(LOG_WARNING, "IMAGE: Alpha mask must be same size as image");
    }
    else if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB)
    {
        TRACELOG(LOG_WARNING, "IMAGE: Alpha mask can not be applied to compressed data formats");
    }
    else
    {
        // Force mask to be Grayscale
        Image mask = ImageCopy(alphaMask);
        if (mask.format != PIXELFORMAT_UNCOMPRESSED_GRAYSCALE) ImageFormat(&mask, PIXELFORMAT_UNCOMPRESSED_GRAYSCALE);

        // In case image is only grayscale, we just add alpha channel
        if (image->format == PIXELFORMAT_UNCOMPRESSED_GRAYSCALE)
        {
            unsigned char *data = (unsigned char *)RL_MALLOC(image->width*image->height*2);

            // Apply alpha mask to alpha channel
            for (int i = 0, k = 0; (i < mask.width*mask.height) || (i < image->width*image->height); i++, k += 2)
            {
                data[k] = ((unsigned char *)image->data)[i];
                data[k + 1] = ((unsigned char *)mask.data)[i];
            }

            RL_FREE(image->data);
            image->data = data;
            image->format = PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA;
        }
        else
        {
            // Convert image to RGBA
            if (image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8A8) ImageFormat(image, PIXELFORMAT_UNCOMPRESSED_R8G8B8A8);

            // Apply alpha mask to alpha channel
            for (int i = 0, k = 3; (i < mask.width*mask.height) || (i < image->width*image->height); i++, k += 4)
            {
                ((unsigned char *)image->data)[k] = ((unsigned char *)mask.data)[i];
            }
        }

        UnloadImage(mask);
    }
}